

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O1

void __thiscall
slang::ast::PredefinedIntegerType::PredefinedIntegerType
          (PredefinedIntegerType *this,Kind integerKind,bool isSigned)

{
  (*(code *)(&DAT_00491fe8 + *(int *)(&DAT_00491fe8 + (ulong)integerKind * 4)))();
  return;
}

Assistant:

std::string_view getName(PredefinedIntegerType::Kind kind) {
    switch (kind) {
        case PredefinedIntegerType::ShortInt: return "shortint"sv;
        case PredefinedIntegerType::Int: return "int"sv;
        case PredefinedIntegerType::LongInt: return "longint"sv;
        case PredefinedIntegerType::Byte: return "byte"sv;
        case PredefinedIntegerType::Integer: return "integer"sv;
        case PredefinedIntegerType::Time: return "time"sv;
    }
    SLANG_UNREACHABLE;
}